

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O3

void Smt_PrsReadLines(Smt_Prs_t *p)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  long lVar7;
  uint uVar8;
  byte *pbVar9;
  byte *pLim;
  byte *pStr;
  ulong uVar10;
  
  if ((p->vStack).nSize != 0) {
    __assert_fail("Vec_IntSize(&p->vStack) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                  ,0x674,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  if ((p->vObjs).nSize != 0) {
    __assert_fail("Vec_WecSize(&p->vObjs) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                  ,0x676,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  Vec_IntPush(&p->vStack,0);
  Vec_WecPushLevel(&p->vObjs);
  pStr = (byte *)p->pBuffer;
  pbVar6 = (byte *)p->pLimit;
  p->pCur = (char *)pStr;
  if (pStr < pbVar6) {
    bVar3 = true;
    pbVar9 = pStr;
    do {
      while( true ) {
        pbVar9 = pbVar9 + 1;
        bVar1 = *pStr;
        uVar10 = (ulong)bVar1;
        if ((0x20 < uVar10) || ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0)) break;
        pStr = pStr + 1;
        p->pCur = (char *)pStr;
      }
      if ((bVar3) && (bVar1 == 0x7c)) {
        while( true ) {
          *pStr = 0x20;
          pStr = (byte *)p->pCur;
          if (*pStr == 0) break;
          if (*pStr == 0x7c) {
            *pStr = 0x20;
            break;
          }
          p->pCur = (char *)(pStr + 1);
        }
        bVar3 = false;
      }
      else if (bVar1 == 0x29) {
        iVar4 = (p->vStack).nSize;
        if (iVar4 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x3ba,"int Vec_IntPop(Vec_Int_t *)");
        }
        (p->vStack).nSize = iVar4 + -1;
      }
      else if (bVar1 == 0x28) {
        lVar7 = (long)(p->vStack).nSize;
        if (lVar7 < 1) {
LAB_0034fd6d:
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x201,"int Vec_IntEntryLast(Vec_Int_t *)");
        }
        iVar4 = (p->vStack).pArray[lVar7 + -1];
        if (((long)iVar4 < 0) || (iVar2 = (p->vObjs).nSize, iVar2 <= iVar4)) {
LAB_0034fd4e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                        ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        Vec_IntPush((p->vObjs).pArray + iVar4,iVar2 * 2);
        Vec_IntPush(&p->vStack,(p->vObjs).nSize);
        Vec_WecPushLevel(&p->vObjs);
      }
      else {
        pLim = pStr;
        if (pStr < pbVar6) {
          while ((0x29 < (byte)uVar10 || ((0x30100002600U >> (uVar10 & 0x3f) & 1) == 0))) {
            p->pCur = (char *)pbVar9;
            pLim = pbVar9;
            if (pbVar9 == pbVar6) goto LAB_0034fca1;
            bVar1 = *pbVar9;
            pbVar9 = pbVar9 + 1;
            uVar10 = (ulong)bVar1;
          }
          pLim = pbVar9 + -1;
        }
LAB_0034fca1:
        if (pLim < pbVar6) {
          p->pCur = (char *)(pLim + -1);
          iVar4 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pStr,(char *)pLim,(int *)0x0);
          lVar7 = (long)(p->vStack).nSize;
          if (lVar7 < 1) goto LAB_0034fd6d;
          iVar2 = (p->vStack).pArray[lVar7 + -1];
          if (((long)iVar2 < 0) || ((p->vObjs).nSize <= iVar2)) goto LAB_0034fd4e;
          if (iVar4 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Vec_IntPush((p->vObjs).pArray + iVar2,iVar4 * 2 + 1);
        }
      }
      pbVar6 = (byte *)p->pLimit;
      pStr = (byte *)(p->pCur + 1);
      p->pCur = (char *)pStr;
      pbVar9 = pStr;
    } while (pStr < pbVar6);
  }
  if ((p->vStack).nSize != 1) {
    __assert_fail("Vec_IntSize(&p->vStack) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                  ,0x6b1,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  uVar5 = (p->vObjs).nSize;
  if (uVar5 != (p->vObjs).nCap) {
    __assert_fail("Vec_WecSize(&p->vObjs) == Vec_WecCap(&p->vObjs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                  ,0x6b2,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  if (1 < uVar5) {
    uVar8 = uVar5 - 1;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + 1;
      bVar3 = 0xf < uVar8;
      uVar8 = uVar8 >> 4;
    } while (bVar3);
  }
  p->nDigits = uVar5;
  return;
}

Assistant:

void Smt_PrsReadLines( Smt_Prs_t * p )
{
    int fFirstTime = 1;
    assert( Vec_IntSize(&p->vStack) == 0 );
    //assert( Vec_WecSize(&p->vDepth) == 0 );
    assert( Vec_WecSize(&p->vObjs) == 0 );
    // add top node at level 0
    //Vec_WecPushLevel( &p->vDepth );
    //Vec_WecPush( &p->vDepth, Vec_IntSize(&p->vStack), Vec_WecSize(&p->vObjs) );
    // add top node
    Vec_IntPush( &p->vStack, Vec_WecSize(&p->vObjs) );
    Vec_WecPushLevel( &p->vObjs );
    // add other nodes
    for ( p->pCur = p->pBuffer; p->pCur < p->pLimit; p->pCur++ )
    {
        Smt_PrsSkipSpaces( p );
        if ( fFirstTime && *p->pCur == '|' )
        {
            fFirstTime = 0;
            *p->pCur = ' ';
            while ( *p->pCur && *p->pCur != '|' )
                *p->pCur++ = ' ';
            if ( *p->pCur == '|' )
                *p->pCur = ' ';
            continue;
        }
        if ( *p->pCur == '(' )
        {
            // add new node at this depth
            //assert( Vec_WecSize(&p->vDepth) >= Vec_IntSize(&p->vStack) );
            //if ( Vec_WecSize(&p->vDepth) == Vec_IntSize(&p->vStack) )
            //    Vec_WecPushLevel(&p->vDepth);
            //Vec_WecPush( &p->vDepth, Vec_IntSize(&p->vStack), Vec_WecSize(&p->vObjs) );
            // add fanin to node on the previous level
            Vec_IntPush( Vec_WecEntry(&p->vObjs, Vec_IntEntryLast(&p->vStack)), Abc_Var2Lit(Vec_WecSize(&p->vObjs), 0) );            
            // add node to the stack
            Vec_IntPush( &p->vStack, Vec_WecSize(&p->vObjs) );
            Vec_WecPushLevel( &p->vObjs );
        }
        else if ( *p->pCur == ')' )
        {
            Vec_IntPop( &p->vStack );
        }
        else  // token
        {
            char * pStart = p->pCur; 
            Smt_PrsSkipNonSpaces( p );
            if ( p->pCur < p->pLimit )
            {
                // remove strange characters (this can lead to name clashes)
                int iToken;
                /* commented out for SMT comp
                char * pTemp;
                if ( *pStart == '?' )
                    *pStart = '_';
                for ( pTemp = pStart; pTemp < p->pCur; pTemp++ )
                    if ( *pTemp == '.' )
                        *pTemp = '_';*/
                // create and save token for this string
                iToken = Abc_NamStrFindOrAddLim( p->pStrs, pStart, p->pCur--, NULL );
                Vec_IntPush( Vec_WecEntry(&p->vObjs, Vec_IntEntryLast(&p->vStack)), Abc_Var2Lit(iToken, 1) );
            }
        }
    }
    assert( Vec_IntSize(&p->vStack) == 1 );
    assert( Vec_WecSize(&p->vObjs) == Vec_WecCap(&p->vObjs) );
    p->nDigits = Abc_Base16Log( Vec_WecSize(&p->vObjs) );
}